

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSetPromiseContinuationCallback
          (JsPromiseContinuationCallback promiseContinuationCallback,void *callbackState)

{
  anon_class_16_2_22c7107e fn;
  JsErrorCode JVar1;
  void *local_18;
  void *callbackState_local;
  JsPromiseContinuationCallback promiseContinuationCallback_local;
  
  fn.callbackState = &local_18;
  fn.promiseContinuationCallback = (JsPromiseContinuationCallback *)&callbackState_local;
  local_18 = callbackState;
  callbackState_local = promiseContinuationCallback;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsSetPromiseContinuationCallback::__0>(fn,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetPromiseContinuationCallback(_In_opt_ JsPromiseContinuationCallback promiseContinuationCallback, _In_opt_ void *callbackState)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        scriptContext->GetLibrary()->SetNativeHostPromiseContinuationFunction((Js::JavascriptLibrary::PromiseContinuationCallback)promiseContinuationCallback, callbackState);
        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}